

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.cpp
# Opt level: O3

Complex __thiscall rtb::Filter::Polynomial<double>::solveFor(Polynomial<double> *this,Complex value)

{
  pointer pcVar1;
  double dVar2;
  double dVar3;
  complex<double> *in_RAX;
  undefined8 uVar4;
  undefined8 extraout_RDX;
  ulong uVar5;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined8 in_XMM1_Qa;
  Complex CVar6;
  double local_78;
  double dStack_70;
  undefined8 local_68;
  undefined8 local_60;
  double local_58 [2];
  undefined1 local_48 [24];
  
  uVar4 = value._M_value._8_8_;
  local_68._4_4_ = in_XMM0_Db;
  local_68._0_4_ = in_XMM0_Da;
  if (this->size_ != 0) {
    dVar2 = 0.0;
    dVar3 = 0.0;
    uVar5 = 0;
    local_60 = in_XMM1_Qa;
    do {
      local_48._8_4_ = SUB84(dVar3,0);
      local_48._0_8_ = dVar2;
      local_48._12_4_ = (int)((ulong)dVar3 >> 0x20);
      pcVar1 = (this->coefficients_).
               super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(this->coefficients_).
                        super__Vector_base<std::complex<double>,_std::allocator<std::complex<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 4) <= uVar5) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar5
                  );
      }
      local_78 = (double)local_68;
      dStack_70 = (double)local_60;
      local_58[0] = (double)uVar5;
      std::pow<double>((complex<double> *)&local_78,local_58);
      pcVar1 = pcVar1 + uVar5;
      local_78 = *(double *)pcVar1->_M_value;
      dStack_70 = *(double *)(pcVar1->_M_value + 8);
      in_RAX = std::complex<double>::operator*=
                         ((complex<double> *)&local_78,(complex<double> *)local_58);
      dVar2 = (double)local_48._0_8_ + local_78;
      dVar3 = (double)local_48._8_8_ + dStack_70;
      uVar5 = (ulong)((int)uVar5 + 1);
      uVar4 = extraout_RDX;
    } while (uVar5 < this->size_);
  }
  CVar6._M_value._8_8_ = uVar4;
  CVar6._M_value._0_8_ = in_RAX;
  return (Complex)CVar6._M_value;
}

Assistant:

typename Polynomial<T>::Complex Polynomial<T>::solveFor(Complex value) const {

            Complex r{ 0 };
            for (unsigned i{ 0 }; i < size_; ++i)
                r += coefficients_.at(i)*std::pow(value, i);
            return r;
        }